

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O1

int SSL_set1_group_ids(SSL *ssl,uint16_t *group_ids,size_t num_group_ids)

{
  bool bVar1;
  uint uVar2;
  Array<unsigned_short> *this;
  Span<const_unsigned_short> group_ids_00;
  
  uVar2 = 0;
  if ((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl != (SSL_CONFIG *)0x0) {
    group_ids_00.size_ = num_group_ids;
    group_ids_00.data_ = group_ids;
    bVar1 = check_group_ids(group_ids_00);
    uVar2 = 0;
    if (bVar1) {
      this = &((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>.
               _M_t.super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->supported_group_list;
      bVar1 = bssl::Array<unsigned_short>::InitUninitialized(this,num_group_ids);
      if (num_group_ids != 0 && bVar1) {
        memmove(this->data_,group_ids,num_group_ids * 2);
      }
      uVar2 = (uint)bVar1;
    }
  }
  return uVar2;
}

Assistant:

int SSL_set1_group_ids(SSL *ssl, const uint16_t *group_ids,
                       size_t num_group_ids) {
  if (!ssl->config) {
    return 0;
  }
  auto span = Span(group_ids, num_group_ids);
  return check_group_ids(span) &&
         ssl->config->supported_group_list.CopyFrom(span);
}